

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::mouseMoveEvent(QPlainTextEdit *this,QMouseEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  QWidgetData *pQVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  LayoutDirection LVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  qreal qVar10;
  undefined1 auVar11 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar12 [16];
  QPoint pos;
  undefined1 *local_50;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00->field_0x348 = this_00->field_0x348 & 0xef;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  uVar3 = QEventPoint::position();
  auVar12._0_8_ =
       (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM1_Qa;
  auVar12._8_8_ =
       (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
       extraout_XMM0_Qa;
  auVar12 = minpd(_DAT_0066f5d0,auVar12);
  auVar11._8_8_ = -(ulong)(-2147483648.0 < auVar12._8_8_);
  auVar11._0_8_ = -(ulong)(-2147483648.0 < auVar12._0_8_);
  uVar4 = movmskpd(uVar3,auVar11);
  uVar9 = 0x8000000000000000;
  if ((uVar4 & 1) != 0) {
    uVar9 = (ulong)(uint)(int)auVar12._0_8_ << 0x20;
  }
  uVar8 = 0x80000000;
  if ((uVar4 & 2) != 0) {
    uVar8 = (ulong)(uint)(int)auVar12._8_8_;
  }
  local_50 = (undefined1 *)(uVar8 | uVar9);
  this_01 = this_00->control;
  LVar5 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar5 == RightToLeft) {
    iVar6 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar7 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar6 = iVar6 - iVar7;
  }
  else {
    iVar6 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar10 = QPlainTextEditPrivate::verticalOffset
                     (this_00,this_00->control->topBlock,this_00->topLine);
  local_48.yp = qVar10 + this_00->topLineFracture;
  local_48.xp = (double)iVar6;
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)e,&local_48,
             (this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (((byte)e[0x44] & 1) != 0) {
    iVar6 = QMouseEvent::source();
    if (iVar6 == 0) {
      pQVar1 = ((this_00->super_QAbstractScrollAreaPrivate).viewport)->data;
      local_48.yp = (qreal)CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                                    (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
      local_48.xp = 0.0;
      cVar2 = QRect::contains((QPoint *)&local_48,SUB81(&local_50,0));
      if (cVar2 == '\0') {
        if ((this_00->autoScrollTimer).m_id == Invalid) {
          QBasicTimer::start(&this_00->autoScrollTimer,100000000,1,this);
        }
      }
      else {
        QBasicTimer::stop();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPlainTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}